

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VRDisplayNode.cpp
# Opt level: O2

map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
* __thiscall
MinVR::VRDisplayNode::getValuesAdded_abi_cxx11_
          (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           *__return_storage_ptr__,VRDisplayNode *this)

{
  _Rb_tree_header *p_Var1;
  mapped_type *pmVar2;
  pointer ppVVar3;
  _Rb_tree_node_base *p_Var4;
  _Self __tmp;
  _List_node_base *p_Var5;
  pointer ppVVar6;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  childOut;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  p_Var1 = &(__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_node_count = 0;
  if ((this->_valuesAdded).
      super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl._M_node._M_size != 0) {
    p_Var5 = (_List_node_base *)&this->_valuesAdded;
    while (p_Var5 = (((_List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)&p_Var5->_M_next)->_M_impl)._M_node.super__List_node_base._M_next,
          p_Var5 != (_List_node_base *)&this->_valuesAdded) {
      std::operator+(&local_90,&this->_name," (");
      (*this->_vptr_VRDisplayNode[3])(&local_70,this);
      std::operator+(&local_50,&local_90,&local_70);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_c0,
                     &local_50,")");
      pmVar2 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator[](__return_storage_ptr__,(key_type *)(p_Var5 + 1));
      std::__cxx11::string::operator=((string *)pmVar2,(string *)&local_c0);
      std::__cxx11::string::~string((string *)&local_c0);
      std::__cxx11::string::~string((string *)&local_50);
      std::__cxx11::string::~string((string *)&local_70);
      std::__cxx11::string::~string((string *)&local_90);
    }
  }
  ppVVar6 = (this->_children).
            super__Vector_base<MinVR::VRDisplayNode_*,_std::allocator<MinVR::VRDisplayNode_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  ppVVar3 = (this->_children).
            super__Vector_base<MinVR::VRDisplayNode_*,_std::allocator<MinVR::VRDisplayNode_*>_>.
            _M_impl.super__Vector_impl_data._M_finish;
  if (ppVVar3 != ppVVar6) {
    for (; ppVVar6 != ppVVar3; ppVVar6 = ppVVar6 + 1) {
      (*(*ppVVar6)->_vptr_VRDisplayNode[10])(&local_c0);
      p_Var4 = local_c0._M_impl.super__Rb_tree_header._M_header._M_left;
      if (local_c0._M_impl.super__Rb_tree_header._M_node_count != 0) {
        for (; (_Rb_tree_header *)p_Var4 != &local_c0._M_impl.super__Rb_tree_header;
            p_Var4 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var4)) {
          pmVar2 = std::
                   map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   ::operator[](__return_storage_ptr__,(key_type *)(p_Var4 + 1));
          std::__cxx11::string::_M_assign((string *)pmVar2);
        }
      }
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::~_Rb_tree(&local_c0);
      ppVVar3 = (this->_children).
                super__Vector_base<MinVR::VRDisplayNode_*,_std::allocator<MinVR::VRDisplayNode_*>_>.
                _M_impl.super__Vector_impl_data._M_finish;
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::map<std::string,std::string> VRDisplayNode::getValuesAdded() {

  std::map<std::string,std::string> out;

  // Stick the node name with the values added.
  if (_valuesAdded.size() > 0) {
    for (std::list<std::string>::iterator it = _valuesAdded.begin();
         it != _valuesAdded.end(); it++) {
      out[*it] = _name + " (" + getType() + ")";
    }
  }

  // Look through all the children nodes, and append their values to
  // the list, with the current node name on the front.
  if (_children.size() > 0) {
		for (std::vector<VRDisplayNode*>::iterator it = _children.begin();
         it != _children.end(); it++) {

      std::map<std::string,std::string> childOut = (*it)->getValuesAdded();

      if (childOut.size() > 0) {
        for (std::map<std::string,std::string>::iterator jt = childOut.begin();
             jt != childOut.end(); jt++) {
          out[jt->first] = jt->second;
        }
      }
		}
	}

  return out;
}